

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlinePass::MoveCallerInstsAfterFunctionCall
          (InlinePass *this,
          unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *preCallSB,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *postCallSB,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,iterator *call_inst_itr,bool multiBlocks)

{
  char cVar1;
  Instruction *this_00;
  Instruction *pIVar2;
  Instruction *pIVar3;
  bool bVar4;
  uint32_t uVar5;
  mapped_type *pmVar6;
  uint32_t rid;
  uint32_t local_4c;
  InlinePass *local_48;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *local_40;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_38;
  
  this_00 = (((call_inst_itr->super_iterator).node_)->
            super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  if (this_00 != (Instruction *)0x0) {
    cVar1 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
    local_48 = this;
    local_40 = preCallSB;
    while (cVar1 == '\0') {
      if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xca,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar2 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar2 == (Instruction *)0x0) {
        __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xcc,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar3 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar3;
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0
      ;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
      local_38._M_head_impl = this_00;
      if (multiBlocks) {
        bVar4 = CloneSameBlockOps(local_48,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                            *)&local_38,postCallSB,local_40,new_blk_ptr);
        if (!bVar4) {
          (*(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase
            [1])(this_00);
          return false;
        }
        if ((this_00->opcode_ == OpImage) || (this_00->opcode_ == OpSampledImage)) {
          uVar5 = 0;
          if (this_00->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
          }
          local_4c = uVar5;
          pmVar6 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)postCallSB,&local_4c);
          *pmVar6 = uVar5;
        }
      }
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(((new_blk_ptr->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->insts_
                  ).super_IntrusiveList<spvtools::opt::Instruction>,this_00);
      this_00 = (((call_inst_itr->super_iterator).node_)->
                super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (this_00 == (Instruction *)0x0) {
        return true;
      }
      cVar1 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
    }
  }
  return true;
}

Assistant:

bool InlinePass::MoveCallerInstsAfterFunctionCall(
    std::unordered_map<uint32_t, Instruction*>* preCallSB,
    std::unordered_map<uint32_t, uint32_t>* postCallSB,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    BasicBlock::iterator call_inst_itr, bool multiBlocks) {
  // Copy remaining instructions from caller block.
  for (Instruction* inst = call_inst_itr->NextNode(); inst;
       inst = call_inst_itr->NextNode()) {
    inst->RemoveFromList();
    std::unique_ptr<Instruction> cp_inst(inst);
    // If multiple blocks generated, regenerate any same-block
    // instruction that has not been seen in this last block.
    if (multiBlocks) {
      if (!CloneSameBlockOps(&cp_inst, postCallSB, preCallSB, new_blk_ptr)) {
        return false;
      }

      // Remember same-block ops in this block.
      if (IsSameBlockOp(&*cp_inst)) {
        const uint32_t rid = cp_inst->result_id();
        (*postCallSB)[rid] = rid;
      }
    }
    new_blk_ptr->get()->AddInstruction(std::move(cp_inst));
  }

  return true;
}